

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O0

int WriteAllRS232Port(RS232PORT *pRS232Port,uint8 *writebuf,int writebuflen)

{
  int writebuflen_local;
  uint8 *writebuf_local;
  RS232PORT *pRS232Port_local;
  
  if (pRS232Port->DevType == 0) {
    pRS232Port_local._4_4_ = WriteAllComputerRS232Port(pRS232Port->hDev,writebuf,writebuflen);
  }
  else if (pRS232Port->DevType - 1U < 4) {
    pRS232Port_local._4_4_ = sendall(pRS232Port->s,(char *)writebuf,writebuflen);
  }
  else {
    pRS232Port_local._4_4_ = 1;
  }
  return pRS232Port_local._4_4_;
}

Assistant:

inline int WriteAllRS232Port(RS232PORT* pRS232Port, uint8* writebuf, int writebuflen)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
	case TCP_SERVER_TYPE_RS232PORT:
	case UDP_CLIENT_TYPE_RS232PORT:
	case UDP_SERVER_TYPE_RS232PORT:
		return sendall(pRS232Port->s, (char*)writebuf, writebuflen);
	case LOCAL_TYPE_RS232PORT:
		return WriteAllComputerRS232Port(pRS232Port->hDev, writebuf, (int)writebuflen);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("WriteAllRS232Port error (%s) : %s"
			"(pRS232Port=%#x, writebuf=%#x, writebuflen=%d)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port, writebuf, writebuflen));
		return EXIT_FAILURE;
	}
}